

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_ws(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *pcVar5;
  char *extraout_RDX_10;
  int yythunkpos0;
  int iVar6;
  int yypos0;
  int iVar7;
  
  iVar7 = G->pos;
  iVar6 = G->thunkpos;
  iVar1 = yymatchChar(G,10);
  if ((iVar1 != 0) && (iVar1 = yy_pod(G), iVar1 != 0)) {
    return 1;
  }
  G->pos = iVar7;
  G->thunkpos = iVar6;
  iVar1 = yymatchString(G,"\n=begin END\n");
  if (iVar1 == 0) {
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchChar(G,0x20);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchChar(G,0xc);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchChar(G,0xb);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchChar(G,9);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchString(G,anon_var_dwarf_4534);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchString(G,anon_var_dwarf_4540);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar7;
    G->thunkpos = iVar6;
    iVar1 = yymatchString(G,"\n=END\n");
    if (iVar1 == 0) {
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yy_end_of_line(G);
      if (iVar1 != 0) {
        return 1;
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yymatchString(G,"#`[");
      pcVar5 = extraout_RDX;
      if (iVar1 != 0) {
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2c60,pcVar5);
          pcVar5 = extraout_RDX_00;
        } while (iVar3 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar1 = yymatchChar(G,0x5d);
        if (iVar1 != 0) {
          return 1;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yymatchString(G,"#`(");
      pcVar5 = extraout_RDX_01;
      if (iVar1 != 0) {
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_4588,pcVar5);
          pcVar5 = extraout_RDX_02;
        } while (iVar3 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar1 = yymatchChar(G,0x29);
        if (iVar1 != 0) {
          return 1;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yymatchString(G,anon_var_dwarf_459c);
      pcVar5 = extraout_RDX_03;
      if (iVar1 != 0) {
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_45a8,pcVar5);
          pcVar5 = extraout_RDX_04;
        } while (iVar3 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar1 = yymatchString(G,anon_var_dwarf_45bc);
        if (iVar1 != 0) {
          return 1;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yymatchString(G,anon_var_dwarf_45c8);
      pcVar5 = extraout_RDX_05;
      if (iVar1 != 0) {
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_45d4,pcVar5);
          pcVar5 = extraout_RDX_06;
        } while (iVar3 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar1 = yymatchString(G,anon_var_dwarf_45e0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar1 = yymatchString(G,anon_var_dwarf_45ec);
      pcVar5 = extraout_RDX_07;
      if (iVar1 != 0) {
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_45f8,pcVar5);
          pcVar5 = extraout_RDX_08;
        } while (iVar3 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar1 = yymatchString(G,anon_var_dwarf_4604);
        if (iVar1 != 0) {
          return 1;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar6;
      iVar2 = yymatchChar(G,0x23);
      iVar1 = 0;
      pcVar5 = extraout_RDX_09;
      if (iVar2 != 0) {
        do {
          iVar2 = G->pos;
          iVar3 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)anon_var_dwarf_244c,pcVar5);
          pcVar5 = extraout_RDX_10;
        } while (iVar4 != 0);
        G->pos = iVar2;
        G->thunkpos = iVar3;
        iVar2 = yy_end_of_line(G);
        if (iVar2 != 0) {
          return 1;
        }
      }
    }
    else {
      iVar1 = 1;
      do {
        iVar7 = G->pos;
        iVar6 = G->thunkpos;
        iVar2 = yymatchDot(G);
      } while (iVar2 != 0);
    }
  }
  else {
    iVar1 = 1;
    do {
      iVar7 = G->pos;
      iVar6 = G->thunkpos;
      iVar2 = yymatchDot(G);
    } while (iVar2 != 0);
  }
  G->pos = iVar7;
  G->thunkpos = iVar6;
  return iVar1;
}

Assistant:

YY_RULE(int) yy_ws(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "ws"));

  {  int yypos996= G->pos, yythunkpos996= G->thunkpos;  if (!yymatchChar(G, '\n')) goto l997;
  if (!yy_pod(G))  goto l997;
  goto l996;
  l997:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=begin END\n")) goto l998;

  l999:;	
  {  int yypos1000= G->pos, yythunkpos1000= G->thunkpos;  if (!yymatchDot(G)) goto l1000;  goto l999;
  l1000:;	  G->pos= yypos1000; G->thunkpos= yythunkpos1000;
  }  goto l996;
  l998:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, ' ')) goto l1001;
  goto l996;
  l1001:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\f')) goto l1002;
  goto l996;
  l1002:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\v')) goto l1003;
  goto l996;
  l1003:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\t')) goto l1004;
  goto l996;
  l1004:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\205")) goto l1005;
  goto l996;
  l1005:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\240")) goto l1006;
  goto l996;
  l1006:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=END\n")) goto l1007;

  l1008:;	
  {  int yypos1009= G->pos, yythunkpos1009= G->thunkpos;  if (!yymatchDot(G)) goto l1009;  goto l1008;
  l1009:;	  G->pos= yypos1009; G->thunkpos= yythunkpos1009;
  }  goto l996;
  l1007:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_end_of_line(G))  goto l1010;
  goto l996;
  l1010:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_comment(G))  goto l995;

  }
  l996:;	  yyprintf((stderr, "  ok   ws"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l995:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "ws"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}